

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

void __thiscall
amrex::DistributionMapping::KnapSackDoIt
          (DistributionMapping *this,vector<long,_std::allocator<long>_> *wgts,int param_2,
          Real *efficiency,bool do_full_knapsack,int nmax,bool sort)

{
  ostringstream *poVar1;
  uint nprocs;
  int rank;
  pointer piVar2;
  pointer pvVar3;
  pointer ppVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  Print *pPVar8;
  int *piVar9;
  pointer piVar10;
  ulong uVar11;
  int iVar12;
  pointer x;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  Vector<int,_std::allocator<int>_> ord;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  vec;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> LIpairV;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  wrkerord;
  Print local_1b8;
  
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    poVar6 = OutStream();
    Print::Print(&local_1b8,poVar6);
    std::operator<<((ostream *)&local_1b8.ss,"DM: KnapSackDoIt called...");
    std::endl<char,std::char_traits<char>>((ostream *)&local_1b8.ss);
    Print::~Print(&local_1b8);
  }
  nprocs = *(uint *)(DAT_006e0650 + -0x38);
  vec.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vec.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vec.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *efficiency = 0.0;
  knapsack(wgts,nprocs,&vec,efficiency,do_full_knapsack,nmax);
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    uVar7 = ((long)vec.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)vec.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    uVar11 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar11 = 0;
    }
    for (uVar7 = 0; uVar7 != uVar11; uVar7 = uVar7 + 1) {
      poVar6 = OutStream();
      Print::Print(&local_1b8,poVar6);
      poVar1 = &local_1b8.ss;
      std::operator<<((ostream *)poVar1,"  Bucket ");
      std::ostream::operator<<(poVar1,(int)uVar7);
      std::operator<<((ostream *)poVar1," contains boxes:");
      std::endl<char,std::char_traits<char>>((ostream *)poVar1);
      Print::~Print(&local_1b8);
      uVar13 = (ulong)((long)vec.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar7].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)vec.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      uVar14 = uVar13 & 0xffffffff;
      if ((int)uVar13 < 1) {
        uVar14 = 0;
      }
      for (lVar15 = 0; uVar14 * 4 != lVar15; lVar15 = lVar15 + 4) {
        poVar6 = OutStream();
        Print::Print(&local_1b8,poVar6);
        std::operator<<((ostream *)&local_1b8.ss,"    ");
        pPVar8 = Print::operator<<(&local_1b8,
                                   (int *)((long)vec.
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + lVar15))
        ;
        std::endl<char,std::char_traits<char>>((ostream *)&pPVar8->ss);
        Print::~Print(&local_1b8);
      }
    }
  }
  pPVar8 = (Print *)&LIpairV;
  LIpairV.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  LIpairV.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LIpairV.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::reserve
            ((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)pPVar8,
             (long)(int)nprocs);
  uVar7 = 0;
  uVar11 = 0;
  if (0 < (int)nprocs) {
    uVar11 = (ulong)nprocs;
  }
  for (; uVar7 != uVar11; uVar7 = uVar7 + 1) {
    local_1b8._0_8_ = 0;
    for (piVar9 = vec.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        piVar9 != vec.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish; piVar9 = piVar9 + 1) {
      local_1b8._0_8_ =
           local_1b8._0_8_ +
           (wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start[*piVar9];
    }
    local_1b8.os._0_4_ = (undefined4)uVar7;
    pPVar8 = (Print *)&LIpairV;
    std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>::
    emplace_back<std::pair<long,int>>
              ((vector<std::pair<long,int>,std::allocator<std::pair<long,int>>> *)&LIpairV,
               (pair<long,_int> *)&local_1b8);
  }
  if (sort) {
    pPVar8 = (Print *)&LIpairV;
    Sort((vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)pPVar8,true);
  }
  ppVar4 = LIpairV.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    for (x = LIpairV.
             super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start; x != ppVar4; x = x + 1) {
      poVar6 = OutStream();
      Print::Print(&local_1b8,poVar6);
      std::operator<<((ostream *)&local_1b8.ss,"  Bucket ");
      pPVar8 = Print::operator<<(&local_1b8,&x->second);
      std::operator<<((ostream *)&pPVar8->ss," total weight: ");
      pPVar8 = Print::operator<<(pPVar8,&x->first);
      std::endl<char,std::char_traits<char>>((ostream *)&pPVar8->ss);
      pPVar8 = &local_1b8;
      Print::~Print(&local_1b8);
    }
  }
  ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wrkerord.
  super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  .
  super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  wrkerord.
  super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  .
  super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  wrkerord.
  super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  .
  super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (sort) {
    LeastUsedCPUs((DistributionMapping *)pPVar8,nprocs,&ord);
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize
              (&ord.super_vector<int,_std::allocator<int>_>,(long)(int)nprocs);
    iVar12 = 0;
    for (piVar10 = ord.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
        piVar10 !=
        ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish; piVar10 = piVar10 + 1) {
      *piVar10 = iVar12;
      iVar12 = iVar12 + 1;
    }
  }
  poVar1 = &local_1b8.ss;
  for (uVar7 = 0;
      pvVar3 = vec.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start, uVar7 != uVar11; uVar7 = uVar7 + 1) {
    iVar12 = LIpairV.
             super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar7].second;
    rank = ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7];
    piVar10 = vec.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar12].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
    piVar2 = vec.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar12].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
      poVar6 = OutStream();
      Print::Print(&local_1b8,poVar6);
      std::operator<<((ostream *)poVar1,"  Mapping bucket ");
      std::ostream::operator<<(poVar1,iVar12);
      std::operator<<((ostream *)poVar1," to rank ");
      std::ostream::operator<<(poVar1,rank);
      std::endl<char,std::char_traits<char>>((ostream *)poVar1);
      Print::~Print(&local_1b8);
    }
    uVar13 = (ulong)((long)piVar10 - (long)piVar2) >> 2;
    uVar14 = uVar13 & 0xffffffff;
    if ((int)uVar13 < 1) {
      uVar14 = 0;
    }
    for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
      iVar5 = ParallelContext::local_to_global_rank(rank);
      *(int *)(*(long *)&(((this->m_ref).
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
              (long)pvVar3[iVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar13] * 4) = iVar5;
    }
  }
  if (verbose != 0) {
    poVar6 = OutStream();
    Print::Print(&local_1b8,poVar6);
    std::operator<<((ostream *)&local_1b8.ss,"KNAPSACK efficiency: ");
    pPVar8 = Print::operator<<(&local_1b8,efficiency);
    std::operator<<((ostream *)&pPVar8->ss,'\n');
    Print::~Print(&local_1b8);
  }
  std::
  vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::~vector(&wrkerord.
             super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
           );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ord);
  std::_Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::~_Vector_base
            (&LIpairV.
              super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&vec);
  return;
}

Assistant:

void
DistributionMapping::KnapSackDoIt (const std::vector<Long>& wgts,
                                   int                    /*  nprocs */,
                                   Real&                    efficiency,
                                   bool                     do_full_knapsack,
                                   int                      nmax,
                                   bool                     sort)
{
    if (flag_verbose_mapper) {
        Print() << "DM: KnapSackDoIt called..." << std::endl;
    }

    BL_PROFILE("DistributionMapping::KnapSackDoIt()");

    int nprocs = ParallelContext::NProcsSub();

    // If team is not use, we are going to treat it as a special case in which
    // the number of teams is nprocs and the number of workers is 1.

    int nteams = nprocs;
    int nworkers = 1;
#if defined(BL_USE_TEAM)
    nteams = ParallelDescriptor::NTeams();
    nworkers = ParallelDescriptor::TeamSize();
#endif

    std::vector< std::vector<int> > vec;

    efficiency = 0;

    knapsack(wgts,nteams,vec,efficiency,do_full_knapsack,nmax);

    if (flag_verbose_mapper) {
        for (int i = 0, ni = vec.size(); i < ni; ++i) {
            Print() << "  Bucket " << i << " contains boxes:" << std::endl;
            for (int j = 0, nj = vec[i].size(); j < nj; ++j) {
                Print() << "    " << vec[i][j] << std::endl;
            }
        }
    }

    BL_ASSERT(static_cast<int>(vec.size()) == nteams);

    std::vector<LIpair> LIpairV;

    LIpairV.reserve(nteams);

    for (int i = 0; i < nteams; ++i)
    {
        Long wgt = 0;
        for (std::vector<int>::const_iterator lit = vec[i].begin(), End = vec[i].end();
             lit != End; ++lit)
        {
            wgt += wgts[*lit];
        }

        LIpairV.push_back(LIpair(wgt,i));
    }

    if (sort) {Sort(LIpairV, true);}

    if (flag_verbose_mapper) {
        for (const auto &p : LIpairV) {
            Print() << "  Bucket " << p.second << " total weight: " << p.first << std::endl;
        }
    }

    Vector<int> ord;
    Vector<Vector<int> > wrkerord;

    if (nteams == nprocs) {
        if (sort) {
            LeastUsedCPUs(nprocs,ord);
        } else {
            ord.resize(nprocs);
            std::iota(ord.begin(), ord.end(), 0);
        }
    } else {
        if (sort) {
            LeastUsedTeams(ord,wrkerord,nteams,nworkers);
        } else {
            ord.resize(nteams);
            std::iota(ord.begin(), ord.end(), 0);
            wrkerord.resize(nteams);
            for (auto& v : wrkerord) {
                v.resize(nworkers);
                std::iota(v.begin(), v.end(), 0);
            }
        }
    }

    for (int i = 0; i < nteams; ++i)
    {
        const int idx = LIpairV[i].second;
        const int tid = ord[i];

        const std::vector<int>& vi = vec[idx];
        const int N = vi.size();

        if (flag_verbose_mapper) {
            Print() << "  Mapping bucket " << idx << " to rank " << tid << std::endl;
        }

        if (nteams == nprocs) {
            for (int j = 0; j < N; ++j)
            {
                m_ref->m_pmap[vi[j]] = ParallelContext::local_to_global_rank(tid);
            }
        } else {
#ifdef BL_USE_TEAM
            int leadrank = tid * nworkers;
            for (int w = 0; w < nworkers; ++w)
            {
                ParallelDescriptor::team_for(0, N, w, [&] (int j) {
                        m_ref->m_pmap[vi[j]] = leadrank + wrkerord[i][w];
                    });
            }
#endif
        }
    }

    if (verbose)
    {
        amrex::Print() << "KNAPSACK efficiency: " << efficiency << '\n';
    }

}